

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

OptionalStorage<llbuild::buildsystem::BuildValue,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
          (OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this,BuildValue *y)

{
  BuildValue *this_00;
  BuildValue *y_local;
  OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this_local;
  
  if ((this->hasVal & 1U) == 0) {
    llbuild::buildsystem::BuildValue::BuildValue((BuildValue *)this,y);
    this->hasVal = true;
  }
  else {
    this_00 = getPointer(this);
    llbuild::buildsystem::BuildValue::operator=(this_00,y);
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasVal)
      *getPointer() = std::move(y);
    else {
      new (storage.buffer) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }